

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O2

void __thiscall
Js::InterpreterStackFrame::
OP_GetRootMethodProperty_NoFastPath<Js::OpLayoutT_ElementRootCP<Js::LayoutSizePolicy<(Js::LayoutSize)0>>const__unaligned>
          (InterpreterStackFrame *this,
          OpLayoutT_ElementRootCP<Js::LayoutSizePolicy<(Js::LayoutSize)0>_> *playout)

{
  InlineCacheIndex inlineCacheIndex;
  FunctionBody *functionBody;
  PropertyId propertyId;
  Var pvVar1;
  InlineCache *inlineCache;
  DynamicObject *object;
  
  propertyId = GetPropertyIdFromCacheId(this,playout->inlineCacheIndex);
  pvVar1 = GetRootObject(this);
  functionBody = *(FunctionBody **)(this + 0x88);
  inlineCache = GetInlineCache(this,playout->inlineCacheIndex);
  inlineCacheIndex = playout->inlineCacheIndex;
  object = UnsafeVarTo<Js::DynamicObject>(pvVar1);
  pvVar1 = JavascriptOperators::PatchGetRootMethod<false,Js::InlineCache>
                     (functionBody,inlineCache,inlineCacheIndex,object,propertyId);
  SetReg<unsigned_char>(this,playout->Value,pvVar1);
  return;
}

Assistant:

_NOINLINE void InterpreterStackFrame::OP_GetRootMethodProperty_NoFastPath(unaligned T *playout)
    {
        PropertyId propertyId = GetPropertyIdFromCacheId(playout->inlineCacheIndex);

        Var rootInstance = this->GetRootObject();

        Var value = JavascriptOperators::PatchGetRootMethod<false>(
            GetFunctionBody(),
            GetInlineCache(playout->inlineCacheIndex),
            playout->inlineCacheIndex,
            UnsafeVarTo<DynamicObject>(rootInstance),
            propertyId
            );

#ifdef TELEMETRY_INTERPRETER
        if (TELEMETRY_PROPERTY_OPCODE_FILTER(propertyId))
        {
            // `successful` will be true as PatchGetMethod throws an exception if not found.
            this->scriptContext->GetTelemetry().GetOpcodeTelemetry().GetMethodProperty(rootInstance, propertyId, value, true);
        }
#endif

        SetReg(playout->Value, value);
    }